

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DAG.h
# Opt level: O0

void __thiscall DAGNode::DAGNode(DAGNode *this,int label,string *op,int left,int right)

{
  allocator local_29;
  int local_28;
  int local_24;
  int right_local;
  int left_local;
  string *op_local;
  DAGNode *pDStack_10;
  int label_local;
  DAGNode *this_local;
  
  this->label = label;
  local_28 = right;
  local_24 = left;
  _right_local = op;
  op_local._4_4_ = label;
  pDStack_10 = this;
  std::__cxx11::string::string((string *)&this->op,(string *)op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->mainMark,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  memset(&this->addMarks,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->addMarks);
  this->left = local_24;
  this->right = local_28;
  this->isDeleted = false;
  return;
}

Assistant:

DAGNode(int label, string op, int left, int right): label(label), mainMark(""), op(op), left(left),
                                                    right(right), addMarks(), isDeleted(false){}